

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void f_parser(lua_State *L,void *ud)

{
  size_t sVar1;
  ZIO *z;
  byte *pbVar2;
  uint firstchar;
  LClosure *cl;
  
  z = *ud;
  sVar1 = z->n;
  z->n = z->n - 1;
  if (sVar1 == 0) {
    firstchar = luaZ_fill(z);
  }
  else {
    pbVar2 = (byte *)z->p;
    z->p = (char *)(pbVar2 + 1);
    firstchar = (uint)*pbVar2;
  }
  if (firstchar == 0x1b) {
    checkmode(L,*(char **)((long)ud + 0x50),"binary");
    cl = luaU_undump(L,*ud,*(char **)((long)ud + 0x58));
  }
  else {
    checkmode(L,*(char **)((long)ud + 0x50),"text");
    cl = luaY_parser(L,*ud,(Mbuffer *)((long)ud + 8),(Dyndata *)((long)ud + 0x20),
                     *(char **)((long)ud + 0x58),firstchar);
  }
  if (cl->p->sizeupvalues == (uint)cl->nupvalues) {
    luaF_initupvals(L,cl);
    return;
  }
  __assert_fail("cl->nupvalues == cl->p->sizeupvalues",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                ,0x37d,"void f_parser(lua_State *, void *)");
}

Assistant:

static void f_parser (lua_State *L, void *ud) {
  LClosure *cl;
  struct SParser *p = cast(struct SParser *, ud);
  int c = zgetc(p->z);  /* read first character */
  if (c == LUA_SIGNATURE[0]) {
    checkmode(L, p->mode, "binary");
    cl = luaU_undump(L, p->z, p->name);
  }
  else {
    checkmode(L, p->mode, "text");
    cl = luaY_parser(L, p->z, &p->buff, &p->dyd, p->name, c);
  }
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luaF_initupvals(L, cl);
}